

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool check_down_shot(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                     *battle_field,string *coordinates)

{
  char *pcVar1;
  mapped_type *pmVar2;
  bool local_19;
  bool result;
  string *coordinates_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  *battle_field_local;
  
  local_19 = false;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)coordinates);
  if (*pcVar1 != '9') {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)coordinates);
    *pcVar1 = *pcVar1 + '\x01';
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
             ::operator[](battle_field,coordinates);
    if ((*pmVar2 == 1) ||
       (pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                 ::operator[](battle_field,coordinates), *pmVar2 == 4)) {
      local_19 = true;
    }
  }
  return local_19;
}

Assistant:

bool check_down_shot(map <string, unsigned short> battle_field, string coordinates){
    bool result=0;
    if (coordinates[1] != '9') {
        ++coordinates[1];
        if((battle_field[coordinates]==1) || (battle_field[coordinates]==4))
            result=1;
    }
    return result;
}